

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O1

void WebPPictureFree(WebPPicture *picture)

{
  if (picture != (WebPPicture *)0x0) {
    WebPSafeFree(picture->memory_);
    WebPSafeFree(picture->memory_argb_);
    picture->argb = (uint32_t *)0x0;
    picture->argb_stride = 0;
    picture->y = (uint8_t *)0x0;
    picture->u = (uint8_t *)0x0;
    picture->v = (uint8_t *)0x0;
    picture->y_stride = 0;
    picture->uv_stride = 0;
    *(undefined8 *)&picture->uv_stride = 0;
    *(undefined8 *)((long)&picture->a + 4) = 0;
    picture->memory_ = (void *)0x0;
    picture->memory_argb_ = (void *)0x0;
  }
  return;
}

Assistant:

void WebPPictureFree(WebPPicture* picture) {
  if (picture != NULL) {
    WebPSafeFree(picture->memory_);
    WebPSafeFree(picture->memory_argb_);
    WebPPictureResetBuffers(picture);
  }
}